

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

double UF::Alloc(uint max_length,PerformanceEvaluator *perf)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double t;
  PerformanceEvaluator *perf_local;
  uint max_length_local;
  
  PerformanceEvaluator::start(perf);
  uVar1 = SUB168(ZEXT416(max_length) * ZEXT816(4),0);
  if (SUB168(ZEXT416(max_length) * ZEXT816(4),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  P_ = (uint *)operator_new__(uVar1);
  memset(P_,0,(ulong)max_length << 2);
  PerformanceEvaluator::stop(perf);
  dVar2 = PerformanceEvaluator::last(perf);
  PerformanceEvaluator::start(perf);
  memset(P_,0,(ulong)max_length << 2);
  PerformanceEvaluator::stop(perf);
  dVar3 = PerformanceEvaluator::last(perf);
  return dVar2 - dVar3;
}

Assistant:

static double Alloc(unsigned max_length, PerformanceEvaluator& perf) {
        perf.start();
        P_ = new unsigned[max_length];
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        double t = perf.last();
        perf.start();
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        return t - perf.last();
    }